

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O3

char __thiscall avro::json::JsonParser::next(JsonParser *this)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  
  uVar4 = ' ';
  if (this->hasNext != false) {
    uVar4 = this->nextChar;
  }
  iVar1 = isspace((int)(char)uVar4);
  if (iVar1 != 0) {
    puVar2 = (this->in_).next_;
    do {
      puVar3 = puVar2;
      if (puVar2 == (this->in_).end_) {
        StreamReader::more(&this->in_);
        puVar3 = (this->in_).next_;
      }
      puVar2 = puVar3 + 1;
      (this->in_).next_ = puVar2;
      uVar4 = *puVar3;
      iVar1 = isspace((int)(char)uVar4);
    } while (iVar1 != 0);
  }
  this->hasNext = false;
  return uVar4;
}

Assistant:

char JsonParser::next()
{
    char ch = hasNext ? nextChar : ' ';
    while (isspace(ch)) {
        ch = in_.read();
    }
    hasNext = false;
    return ch;
}